

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOpaqueAttribute.cpp
# Opt level: O2

void __thiscall
Imf_3_4::OpaqueAttribute::readValueFrom(OpaqueAttribute *this,IStream *is,int size,int version)

{
  Array<char>::resizeErase(&this->_data,(long)size);
  this->_dataSize = (long)size;
  (*is->_vptr_IStream[3])(is,(this->_data)._data,(ulong)(uint)size);
  return;
}

Assistant:

void
OpaqueAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    _data.resizeErase (size);
    _dataSize = size;
    Xdr::read<StreamIO> (is, _data, size);
}